

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_containers_array.cpp
# Opt level: O0

int main(void)

{
  enable_if_t<(std::is_integral_v<decltype(0)>_&&_0_<_enum_count<Color>()),_const_RGB_&> pRVar1;
  ostream *poVar2;
  enable_if_t<(std::is_integral_v<decltype(1)>_&&_1_<_enum_count<Color>()),_const_RGB_&> pRVar3;
  enable_if_t<(std::is_integral_v<decltype(2)>_&&_2_<_enum_count<Color>()),_const_RGB_&> pRVar4;
  enable_if_t<std::is_same_v<decltype((Color)1),_Color>_&&_enum_contains((Color)1),_const_RGB_&>
  pRVar5;
  enable_if_t<std::is_same_v<decltype((Color)2),_Color>_&&_enum_contains((Color)2),_const_RGB_&>
  pRVar6;
  enable_if_t<std::is_same_v<decltype((Color)4),_Color>_&&_enum_contains((Color)4),_const_RGB_&>
  pRVar7;
  undefined1 local_18 [8];
  array<Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
  color_rgb_initializer;
  
  color_rgb_initializer.a._M_elems[1].g = '\0';
  color_rgb_initializer.a._M_elems[1].b = '\0';
  color_rgb_initializer.a._M_elems[2].r = '\0';
  color_rgb_initializer.a._M_elems[2].g = '\0';
  local_18[0] = 0xff;
  local_18[1] = '\0';
  local_18[2] = '\0';
  local_18[3] = '\0';
  local_18[4] = 0xff;
  local_18[5] = '\0';
  local_18[6] = '\0';
  local_18[7] = '\0';
  color_rgb_initializer.a._M_elems[0].r = 0xff;
  pRVar1 = magic_enum::containers::
           get<0,_Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
                     ((array<Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
                       *)local_18);
  poVar2 = operator<<((ostream *)&std::cout,*pRVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pRVar3 = magic_enum::containers::
           get<1,_Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
                     ((array<Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
                       *)local_18);
  poVar2 = operator<<((ostream *)&std::cout,*pRVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pRVar4 = magic_enum::containers::
           get<2,_Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
                     ((array<Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
                       *)local_18);
  poVar2 = operator<<((ostream *)&std::cout,*pRVar4);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pRVar5 = magic_enum::containers::
           get<(Color)1,_Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
                     ((array<Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
                       *)local_18);
  poVar2 = operator<<((ostream *)&std::cout,*pRVar5);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pRVar6 = magic_enum::containers::
           get<(Color)2,_Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
                     ((array<Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
                       *)local_18);
  poVar2 = operator<<((ostream *)&std::cout,*pRVar6);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pRVar7 = magic_enum::containers::
           get<(Color)4,_Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
                     ((array<Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
                       *)local_18);
  poVar2 = operator<<((ostream *)&std::cout,*pRVar7);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {

  constexpr magic_enum::containers::array<Color, RGB> color_rgb_initializer {{{{color_max, 0, 0}, {0, color_max, 0}, {0, 0, color_max}}}};

  std::cout << magic_enum::containers::get<0>(color_rgb_initializer) << std::endl; // R=255 G=0 B=0
  std::cout << magic_enum::containers::get<1>(color_rgb_initializer) << std::endl; // R=0 G=255 B=0
  std::cout << magic_enum::containers::get<2>(color_rgb_initializer) << std::endl; // R=0 G=0 B=255

  std::cout << magic_enum::containers::get<Color::RED>(color_rgb_initializer) << std::endl; // R=255 G=0 B=0
  std::cout << magic_enum::containers::get<Color::GREEN>(color_rgb_initializer) << std::endl; // R=0 G=255 B=0
  std::cout << magic_enum::containers::get<Color::BLUE>(color_rgb_initializer) << std::endl; // R=0 G=0 B=255

  return 0;
}